

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int ZSTDMT_isOverlapped(buffer_t buffer,range_t range)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  bool local_49;
  BYTE *rangeEnd;
  BYTE *bufferEnd;
  BYTE *rangeStart;
  BYTE *bufferStart;
  range_t range_local;
  buffer_t buffer_local;
  uint local_4;
  
  pvVar3 = range.start;
  pvVar4 = buffer.start;
  if ((pvVar3 == (void *)0x0) || (pvVar4 == (void *)0x0)) {
    local_4 = 0;
  }
  else {
    pvVar1 = (void *)((long)pvVar4 + buffer.capacity);
    pvVar2 = (void *)((long)pvVar3 + range.size);
    if ((pvVar4 == pvVar1) || (pvVar3 == pvVar2)) {
      local_4 = 0;
    }
    else {
      local_49 = pvVar4 < pvVar2 && pvVar3 < pvVar1;
      local_4 = (uint)local_49;
    }
  }
  return local_4;
}

Assistant:

static int ZSTDMT_isOverlapped(buffer_t buffer, range_t range)
{
    BYTE const* const bufferStart = (BYTE const*)buffer.start;
    BYTE const* const rangeStart = (BYTE const*)range.start;

    if (rangeStart == NULL || bufferStart == NULL)
        return 0;

    {
        BYTE const* const bufferEnd = bufferStart + buffer.capacity;
        BYTE const* const rangeEnd = rangeStart + range.size;

        /* Empty ranges cannot overlap */
        if (bufferStart == bufferEnd || rangeStart == rangeEnd)
            return 0;

        return bufferStart < rangeEnd && rangeStart < bufferEnd;
    }
}